

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.h
# Opt level: O0

void __thiscall pbrt::BlackbodySpectrum::BlackbodySpectrum(BlackbodySpectrum *this,Float T)

{
  undefined4 *in_RDI;
  undefined4 in_XMM0_Da;
  Float FVar1;
  Float unaff_retaddr;
  Float lambdaMax;
  
  *in_RDI = in_XMM0_Da;
  FVar1 = Blackbody(unaff_retaddr,(Float)((ulong)in_RDI >> 0x20));
  in_RDI[1] = 1.0 / FVar1;
  return;
}

Assistant:

PBRT_CPU_GPU
    BlackbodySpectrum(Float T) : T(T) {
        // Compute blackbody normalization constant for given temperature
        Float lambdaMax = Float(2.8977721e-3 / T * 1e9);
        normalizationFactor = 1 / Blackbody(lambdaMax, T);
    }